

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::DeleteComponents(ON_Mesh *this,ON_COMPONENT_INDEX *ci_list,size_t ci_count)

{
  bool bRemoveEmptyNgons;
  bool bRemoveUnusedVertices;
  bool bRemoveDegenerateFaces;
  bool bIgnoreInvalidComponents;
  size_t ci_count_local;
  ON_COMPONENT_INDEX *ci_list_local;
  ON_Mesh *this_local;
  
  if (ci_count == 0) {
    this_local._7_1_ = true;
  }
  else if (ci_list == (ON_COMPONENT_INDEX *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = DeleteComponents(this,ci_list,ci_count,true,false,true,true);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Mesh::DeleteComponents(
  const ON_COMPONENT_INDEX* ci_list,
  size_t ci_count
  )
{
  if (ci_count <= 0)
    return true;

  if (nullptr == ci_list)
    return false;

  bool bIgnoreInvalidComponents = true;
  bool bRemoveDegenerateFaces = false;
  bool bRemoveUnusedVertices = true;
  bool bRemoveEmptyNgons = true;

  return DeleteComponents(
  ci_list,ci_count,
  bIgnoreInvalidComponents,
  bRemoveDegenerateFaces,
  bRemoveUnusedVertices,
  bRemoveEmptyNgons
  );
}